

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

uint __thiscall Memory::LargeHeapBlock::GetMarkCount(LargeHeapBlock *this)

{
  Recycler *pRVar1;
  _func_int **pp_Var2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  
  if (this->allocCount == 0) {
    uVar5 = 0;
  }
  else {
    pRVar1 = this->heapInfo->recycler;
    uVar4 = 0;
    uVar5 = 0;
    do {
      pp_Var2 = (&this[1].super_HeapBlock._vptr_HeapBlock)[uVar4];
      if ((pp_Var2 != (_func_int **)0x0) && (uVar4 == *(uint *)pp_Var2)) {
        bVar3 = HeapBlockMap64::IsMarked(&pRVar1->heapBlockMap,pp_Var2 + 4);
        uVar5 = uVar5 + bVar3;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->allocCount);
  }
  return uVar5;
}

Assistant:

uint
LargeHeapBlock::GetMarkCount()
{
    uint markCount = 0;
    const HeapBlockMap& heapBlockMap = this->heapInfo->recycler->heapBlockMap;

    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader* header = this->HeaderList()[i];
        if (header && header->objectIndex == i && heapBlockMap.IsMarked(header->GetAddress()))
        {
            markCount++;
        }
    }

    return markCount;
}